

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersector1<4,_1,_false,_embree::avx2::ArrayIntersector1<embree::avx2::InstanceArrayIntersector1>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  uint uVar2;
  ulong uVar3;
  undefined1 (*pauVar4) [16];
  uint uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  Primitive *prim;
  ulong uVar15;
  ulong unaff_R14;
  size_t mask;
  undefined4 uVar16;
  vint4 bi_1;
  undefined1 auVar18 [16];
  vint4 bi;
  undefined1 auVar19 [16];
  vint4 ai;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  Precalculations pre;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  Precalculations local_1031;
  ulong local_1030;
  ulong local_1028;
  ulong local_1020;
  undefined1 local_1018 [16];
  ulong local_1008;
  ulong local_1000;
  undefined1 (*local_ff8) [16];
  ulong local_ff0;
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  undefined1 auVar17 [64];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f70 = 0;
    if (local_f78 != 8) {
      auVar18 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar19 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      aVar1 = (ray->super_RayK<1>).dir.field_0;
      auVar21._8_4_ = 0x7fffffff;
      auVar21._0_8_ = 0x7fffffff7fffffff;
      auVar21._12_4_ = 0x7fffffff;
      auVar21 = vandps_avx((undefined1  [16])aVar1,auVar21);
      auVar23._8_4_ = 0x219392ef;
      auVar23._0_8_ = 0x219392ef219392ef;
      auVar23._12_4_ = 0x219392ef;
      auVar21 = vcmpps_avx(auVar21,auVar23,1);
      auVar21 = vblendvps_avx((undefined1  [16])aVar1,auVar23,auVar21);
      auVar23 = vrcpps_avx(auVar21);
      auVar24._8_4_ = 0x3f800000;
      auVar24._0_8_ = &DAT_3f8000003f800000;
      auVar24._12_4_ = 0x3f800000;
      auVar21 = vfnmadd231ps_fma(auVar24,auVar23,auVar21);
      auVar24 = vfmadd132ps_fma(auVar21,auVar23,auVar23);
      fVar22 = auVar24._0_4_;
      local_ff8 = (undefined1 (*) [16])local_f68;
      local_f88._4_4_ = fVar22;
      local_f88._0_4_ = fVar22;
      local_f88._8_4_ = fVar22;
      local_f88._12_4_ = fVar22;
      auVar29 = ZEXT1664(local_f88);
      auVar21 = vmovshdup_avx(auVar24);
      local_f98 = vshufps_avx(auVar24,auVar24,0x55);
      auVar30 = ZEXT1664(local_f98);
      auVar23 = vshufpd_avx(auVar24,auVar24,1);
      auVar27._0_4_ = fVar22 * (ray->super_RayK<1>).org.field_0.m128[0];
      auVar27._4_4_ = auVar24._4_4_ * (ray->super_RayK<1>).org.field_0.m128[1];
      auVar27._8_4_ = auVar24._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2];
      auVar27._12_4_ = auVar24._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3];
      local_fa8 = vshufps_avx(auVar24,auVar24,0xaa);
      auVar31 = ZEXT1664(local_fa8);
      auVar24 = vshufps_avx(auVar27,auVar27,0x55);
      auVar20 = vshufps_avx(auVar27,auVar27,0xaa);
      local_1000 = (ulong)(fVar22 < 0.0) << 4;
      local_1008 = (ulong)(auVar21._0_4_ < 0.0) << 4 | 0x20;
      local_1020 = (ulong)(auVar23._0_4_ < 0.0) << 4 | 0x40;
      local_1028 = local_1000 ^ 0x10;
      local_1030 = local_1008 ^ 0x10;
      local_ff0 = local_1020 ^ 0x10;
      uVar16 = auVar19._0_4_;
      auVar17 = ZEXT1664(CONCAT412(uVar16,CONCAT48(uVar16,CONCAT44(uVar16,uVar16))));
      uVar7 = CONCAT44(auVar27._0_4_,auVar27._0_4_);
      local_fb8._0_8_ = uVar7 ^ 0x8000000080000000;
      local_fb8._8_4_ = -auVar27._0_4_;
      local_fb8._12_4_ = -auVar27._0_4_;
      auVar26 = ZEXT1664(local_fb8);
      local_fc8._0_8_ = auVar24._0_8_ ^ 0x8000000080000000;
      local_fc8._8_4_ = auVar24._8_4_ ^ 0x80000000;
      local_fc8._12_4_ = auVar24._12_4_ ^ 0x80000000;
      auVar28 = ZEXT1664(local_fc8);
      local_fd8._0_8_ = auVar20._0_8_ ^ 0x8000000080000000;
      local_fd8._8_4_ = auVar20._8_4_ ^ 0x80000000;
      local_fd8._12_4_ = auVar20._12_4_ ^ 0x80000000;
      auVar32 = ZEXT1664(local_fd8);
      uVar16 = auVar18._0_4_;
      local_fe8._4_4_ = uVar16;
      local_fe8._0_4_ = uVar16;
      local_fe8._8_4_ = uVar16;
      local_fe8._12_4_ = uVar16;
      auVar33 = ZEXT1664(local_fe8);
      uVar7 = local_1000;
      uVar10 = local_1020;
      uVar11 = local_1028;
      uVar12 = local_1030;
      uVar15 = local_1008;
      do {
        do {
          if (local_ff8 == (undefined1 (*) [16])&local_f78) {
            return;
          }
          pauVar4 = local_ff8 + -1;
          local_ff8 = local_ff8 + -1;
        } while ((ray->super_RayK<1>).tfar < *(float *)(*pauVar4 + 8));
        uVar14 = *(ulong *)*local_ff8;
        do {
          if ((uVar14 & 8) == 0) {
            auVar21 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar14 + 0x20 + uVar7),auVar26._0_16_,
                                      auVar29._0_16_);
            auVar18 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar14 + 0x20 + uVar15),auVar28._0_16_,
                                      auVar30._0_16_);
            auVar21 = vpmaxsd_avx(auVar21,auVar18);
            auVar18 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar14 + 0x20 + uVar10),auVar32._0_16_,
                                      auVar31._0_16_);
            auVar18 = vpmaxsd_avx(auVar18,auVar33._0_16_);
            local_1018 = vpmaxsd_avx(auVar21,auVar18);
            auVar21 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar14 + 0x20 + uVar11),auVar26._0_16_,
                                      auVar29._0_16_);
            auVar18 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar14 + 0x20 + uVar12),auVar28._0_16_,
                                      auVar30._0_16_);
            auVar21 = vpminsd_avx(auVar21,auVar18);
            auVar18 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar14 + 0x20 + local_ff0),
                                      auVar32._0_16_,auVar31._0_16_);
            auVar18 = vpminsd_avx(auVar18,auVar17._0_16_);
            auVar21 = vpminsd_avx(auVar21,auVar18);
            auVar21 = vpcmpgtd_avx(local_1018,auVar21);
            uVar5 = vmovmskps_avx(auVar21);
            unaff_R14 = ((ulong)uVar5 ^ 0xf) & 0xff;
          }
          if ((uVar14 & 8) == 0) {
            if (unaff_R14 == 0) {
              iVar6 = 4;
            }
            else {
              uVar13 = uVar14 & 0xfffffffffffffff0;
              lVar8 = 0;
              for (uVar14 = unaff_R14; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000)
              {
                lVar8 = lVar8 + 1;
              }
              iVar6 = 0;
              uVar9 = unaff_R14 - 1 & unaff_R14;
              uVar14 = *(ulong *)(uVar13 + lVar8 * 8);
              if (uVar9 != 0) {
                uVar5 = *(uint *)(local_1018 + lVar8 * 4);
                lVar8 = 0;
                for (uVar10 = uVar9; (uVar10 & 1) == 0; uVar10 = uVar10 >> 1 | 0x8000000000000000) {
                  lVar8 = lVar8 + 1;
                }
                uVar9 = uVar9 - 1 & uVar9;
                uVar3 = *(ulong *)(uVar13 + lVar8 * 8);
                uVar2 = *(uint *)(local_1018 + lVar8 * 4);
                uVar10 = local_1020;
                uVar11 = local_1028;
                uVar12 = local_1030;
                if (uVar9 == 0) {
                  if (uVar5 < uVar2) {
                    *(ulong *)*local_ff8 = uVar3;
                    *(uint *)(*local_ff8 + 8) = uVar2;
                    local_ff8 = local_ff8 + 1;
                  }
                  else {
                    *(ulong *)*local_ff8 = uVar14;
                    *(uint *)(*local_ff8 + 8) = uVar5;
                    uVar14 = uVar3;
                    local_ff8 = local_ff8 + 1;
                  }
                }
                else {
                  auVar18._8_8_ = 0;
                  auVar18._0_8_ = uVar14;
                  auVar21 = vpunpcklqdq_avx(auVar18,ZEXT416(uVar5));
                  auVar19._8_8_ = 0;
                  auVar19._0_8_ = uVar3;
                  auVar18 = vpunpcklqdq_avx(auVar19,ZEXT416(uVar2));
                  lVar8 = 0;
                  for (uVar14 = uVar9; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000)
                  {
                    lVar8 = lVar8 + 1;
                  }
                  uVar9 = uVar9 - 1 & uVar9;
                  auVar20._8_8_ = 0;
                  auVar20._0_8_ = *(ulong *)(uVar13 + lVar8 * 8);
                  auVar23 = vpunpcklqdq_avx(auVar20,ZEXT416(*(uint *)(local_1018 + lVar8 * 4)));
                  auVar19 = vpcmpgtd_avx(auVar18,auVar21);
                  if (uVar9 == 0) {
                    auVar24 = vpshufd_avx(auVar19,0xaa);
                    auVar19 = vblendvps_avx(auVar18,auVar21,auVar24);
                    auVar21 = vblendvps_avx(auVar21,auVar18,auVar24);
                    auVar18 = vpcmpgtd_avx(auVar23,auVar19);
                    auVar24 = vpshufd_avx(auVar18,0xaa);
                    auVar18 = vblendvps_avx(auVar23,auVar19,auVar24);
                    auVar19 = vblendvps_avx(auVar19,auVar23,auVar24);
                    auVar23 = vpcmpgtd_avx(auVar19,auVar21);
                    auVar24 = vpshufd_avx(auVar23,0xaa);
                    auVar23 = vblendvps_avx(auVar19,auVar21,auVar24);
                    auVar21 = vblendvps_avx(auVar21,auVar19,auVar24);
                    *local_ff8 = auVar21;
                    local_ff8[1] = auVar23;
                    uVar14 = auVar18._0_8_;
                    local_ff8 = local_ff8 + 2;
                  }
                  else {
                    lVar8 = 0;
                    for (; (uVar9 & 1) == 0; uVar9 = uVar9 >> 1 | 0x8000000000000000) {
                      lVar8 = lVar8 + 1;
                    }
                    auVar25._8_8_ = 0;
                    auVar25._0_8_ = *(ulong *)(uVar13 + lVar8 * 8);
                    auVar20 = vpunpcklqdq_avx(auVar25,ZEXT416(*(uint *)(local_1018 + lVar8 * 4)));
                    auVar24 = vpshufd_avx(auVar19,0xaa);
                    auVar19 = vblendvps_avx(auVar18,auVar21,auVar24);
                    auVar21 = vblendvps_avx(auVar21,auVar18,auVar24);
                    auVar18 = vpcmpgtd_avx(auVar20,auVar23);
                    auVar24 = vpshufd_avx(auVar18,0xaa);
                    auVar18 = vblendvps_avx(auVar20,auVar23,auVar24);
                    auVar23 = vblendvps_avx(auVar23,auVar20,auVar24);
                    auVar24 = vpcmpgtd_avx(auVar23,auVar21);
                    auVar20 = vpshufd_avx(auVar24,0xaa);
                    auVar24 = vblendvps_avx(auVar23,auVar21,auVar20);
                    auVar21 = vblendvps_avx(auVar21,auVar23,auVar20);
                    auVar23 = vpcmpgtd_avx(auVar18,auVar19);
                    auVar20 = vpshufd_avx(auVar23,0xaa);
                    auVar23 = vblendvps_avx(auVar18,auVar19,auVar20);
                    auVar18 = vblendvps_avx(auVar19,auVar18,auVar20);
                    auVar19 = vpcmpgtd_avx(auVar24,auVar18);
                    auVar20 = vpshufd_avx(auVar19,0xaa);
                    auVar19 = vblendvps_avx(auVar24,auVar18,auVar20);
                    auVar18 = vblendvps_avx(auVar18,auVar24,auVar20);
                    *local_ff8 = auVar21;
                    local_ff8[1] = auVar18;
                    local_ff8[2] = auVar19;
                    uVar14 = auVar23._0_8_;
                    local_ff8 = local_ff8 + 3;
                  }
                }
              }
            }
          }
          else {
            iVar6 = 6;
          }
        } while (iVar6 == 0);
        if (iVar6 == 6) {
          lVar8 = (ulong)((uint)uVar14 & 0xf) - 8;
          if (lVar8 != 0) {
            prim = (Primitive *)(uVar14 & 0xfffffffffffffff0);
            do {
              InstanceArrayIntersector1::intersect(&local_1031,ray,context,prim);
              prim = prim + 1;
              lVar8 = lVar8 + -1;
            } while (lVar8 != 0);
          }
          fVar22 = (ray->super_RayK<1>).tfar;
          auVar17 = ZEXT1664(CONCAT412(fVar22,CONCAT48(fVar22,CONCAT44(fVar22,fVar22))));
          auVar29 = ZEXT1664(local_f88);
          auVar30 = ZEXT1664(local_f98);
          auVar31 = ZEXT1664(local_fa8);
          auVar26 = ZEXT1664(local_fb8);
          auVar28 = ZEXT1664(local_fc8);
          auVar32 = ZEXT1664(local_fd8);
          auVar33 = ZEXT1664(local_fe8);
          uVar7 = local_1000;
          uVar10 = local_1020;
          uVar11 = local_1028;
          uVar12 = local_1030;
          uVar15 = local_1008;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }